

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_module(char *module)

{
  int iVar1;
  char *module_local;
  
  iVar1 = strcmp(module,"HTMLparser");
  if (iVar1 == 0) {
    module_local._4_4_ = test_HTMLparser();
  }
  else {
    iVar1 = strcmp(module,"HTMLtree");
    if (iVar1 == 0) {
      module_local._4_4_ = test_HTMLtree();
    }
    else {
      iVar1 = strcmp(module,"SAX2");
      if (iVar1 == 0) {
        module_local._4_4_ = test_SAX2();
      }
      else {
        iVar1 = strcmp(module,"c14n");
        if (iVar1 == 0) {
          module_local._4_4_ = test_c14n();
        }
        else {
          iVar1 = strcmp(module,"catalog");
          if (iVar1 == 0) {
            module_local._4_4_ = test_catalog();
          }
          else {
            iVar1 = strcmp(module,"chvalid");
            if (iVar1 == 0) {
              module_local._4_4_ = test_chvalid();
            }
            else {
              iVar1 = strcmp(module,"debugXML");
              if (iVar1 == 0) {
                module_local._4_4_ = test_debugXML();
              }
              else {
                iVar1 = strcmp(module,"dict");
                if (iVar1 == 0) {
                  module_local._4_4_ = test_dict();
                }
                else {
                  iVar1 = strcmp(module,"encoding");
                  if (iVar1 == 0) {
                    module_local._4_4_ = test_encoding();
                  }
                  else {
                    iVar1 = strcmp(module,"entities");
                    if (iVar1 == 0) {
                      module_local._4_4_ = test_entities();
                    }
                    else {
                      iVar1 = strcmp(module,"hash");
                      if (iVar1 == 0) {
                        module_local._4_4_ = test_hash();
                      }
                      else {
                        iVar1 = strcmp(module,"list");
                        if (iVar1 == 0) {
                          module_local._4_4_ = test_list();
                        }
                        else {
                          iVar1 = strcmp(module,"nanoftp");
                          if (iVar1 == 0) {
                            module_local._4_4_ = test_nanoftp();
                          }
                          else {
                            iVar1 = strcmp(module,"nanohttp");
                            if (iVar1 == 0) {
                              module_local._4_4_ = test_nanohttp();
                            }
                            else {
                              iVar1 = strcmp(module,"parser");
                              if (iVar1 == 0) {
                                module_local._4_4_ = test_parser();
                              }
                              else {
                                iVar1 = strcmp(module,"parserInternals");
                                if (iVar1 == 0) {
                                  module_local._4_4_ = test_parserInternals();
                                }
                                else {
                                  iVar1 = strcmp(module,"pattern");
                                  if (iVar1 == 0) {
                                    module_local._4_4_ = test_pattern();
                                  }
                                  else {
                                    iVar1 = strcmp(module,"relaxng");
                                    if (iVar1 == 0) {
                                      module_local._4_4_ = test_relaxng();
                                    }
                                    else {
                                      iVar1 = strcmp(module,"schemasInternals");
                                      if (iVar1 == 0) {
                                        module_local._4_4_ = test_schemasInternals();
                                      }
                                      else {
                                        iVar1 = strcmp(module,"schematron");
                                        if (iVar1 == 0) {
                                          module_local._4_4_ = test_schematron();
                                        }
                                        else {
                                          iVar1 = strcmp(module,"tree");
                                          if (iVar1 == 0) {
                                            module_local._4_4_ = test_tree();
                                          }
                                          else {
                                            iVar1 = strcmp(module,"uri");
                                            if (iVar1 == 0) {
                                              module_local._4_4_ = test_uri();
                                            }
                                            else {
                                              iVar1 = strcmp(module,"valid");
                                              if (iVar1 == 0) {
                                                module_local._4_4_ = test_valid();
                                              }
                                              else {
                                                iVar1 = strcmp(module,"xinclude");
                                                if (iVar1 == 0) {
                                                  module_local._4_4_ = test_xinclude();
                                                }
                                                else {
                                                  iVar1 = strcmp(module,"xmlIO");
                                                  if (iVar1 == 0) {
                                                    module_local._4_4_ = test_xmlIO();
                                                  }
                                                  else {
                                                    iVar1 = strcmp(module,"xmlautomata");
                                                    if (iVar1 == 0) {
                                                      module_local._4_4_ = test_xmlautomata();
                                                    }
                                                    else {
                                                      iVar1 = strcmp(module,"xmlerror");
                                                      if (iVar1 == 0) {
                                                        module_local._4_4_ = test_xmlerror();
                                                      }
                                                      else {
                                                        iVar1 = strcmp(module,"xmlmodule");
                                                        if (iVar1 == 0) {
                                                          module_local._4_4_ = test_xmlmodule();
                                                        }
                                                        else {
                                                          iVar1 = strcmp(module,"xmlreader");
                                                          if (iVar1 == 0) {
                                                            module_local._4_4_ = test_xmlreader();
                                                          }
                                                          else {
                                                            iVar1 = strcmp(module,"xmlregexp");
                                                            if (iVar1 == 0) {
                                                              module_local._4_4_ = test_xmlregexp();
                                                            }
                                                            else {
                                                              iVar1 = strcmp(module,"xmlsave");
                                                              if (iVar1 == 0) {
                                                                module_local._4_4_ = test_xmlsave();
                                                              }
                                                              else {
                                                                iVar1 = strcmp(module,"xmlschemas");
                                                                if (iVar1 == 0) {
                                                                  module_local._4_4_ =
                                                                       test_xmlschemas();
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(module,
                                                  "xmlschemastypes");
                                                  if (iVar1 == 0) {
                                                    module_local._4_4_ = test_xmlschemastypes();
                                                  }
                                                  else {
                                                    iVar1 = strcmp(module,"xmlstring");
                                                    if (iVar1 == 0) {
                                                      module_local._4_4_ = test_xmlstring();
                                                    }
                                                    else {
                                                      iVar1 = strcmp(module,"xmlunicode");
                                                      if (iVar1 == 0) {
                                                        module_local._4_4_ = test_xmlunicode();
                                                      }
                                                      else {
                                                        iVar1 = strcmp(module,"xmlwriter");
                                                        if (iVar1 == 0) {
                                                          module_local._4_4_ = test_xmlwriter();
                                                        }
                                                        else {
                                                          iVar1 = strcmp(module,"xpath");
                                                          if (iVar1 == 0) {
                                                            module_local._4_4_ = test_xpath();
                                                          }
                                                          else {
                                                            iVar1 = strcmp(module,"xpathInternals");
                                                            if (iVar1 == 0) {
                                                              module_local._4_4_ =
                                                                   test_xpathInternals();
                                                            }
                                                            else {
                                                              iVar1 = strcmp(module,"xpointer");
                                                              if (iVar1 == 0) {
                                                                module_local._4_4_ = test_xpointer()
                                                                ;
                                                              }
                                                              else {
                                                                module_local._4_4_ = 0;
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return module_local._4_4_;
}

Assistant:

static int
test_module(const char *module) {
    if (!strcmp(module, "HTMLparser")) return(test_HTMLparser());
    if (!strcmp(module, "HTMLtree")) return(test_HTMLtree());
    if (!strcmp(module, "SAX2")) return(test_SAX2());
    if (!strcmp(module, "c14n")) return(test_c14n());
    if (!strcmp(module, "catalog")) return(test_catalog());
    if (!strcmp(module, "chvalid")) return(test_chvalid());
    if (!strcmp(module, "debugXML")) return(test_debugXML());
    if (!strcmp(module, "dict")) return(test_dict());
    if (!strcmp(module, "encoding")) return(test_encoding());
    if (!strcmp(module, "entities")) return(test_entities());
    if (!strcmp(module, "hash")) return(test_hash());
    if (!strcmp(module, "list")) return(test_list());
    if (!strcmp(module, "nanoftp")) return(test_nanoftp());
    if (!strcmp(module, "nanohttp")) return(test_nanohttp());
    if (!strcmp(module, "parser")) return(test_parser());
    if (!strcmp(module, "parserInternals")) return(test_parserInternals());
    if (!strcmp(module, "pattern")) return(test_pattern());
    if (!strcmp(module, "relaxng")) return(test_relaxng());
    if (!strcmp(module, "schemasInternals")) return(test_schemasInternals());
    if (!strcmp(module, "schematron")) return(test_schematron());
    if (!strcmp(module, "tree")) return(test_tree());
    if (!strcmp(module, "uri")) return(test_uri());
    if (!strcmp(module, "valid")) return(test_valid());
    if (!strcmp(module, "xinclude")) return(test_xinclude());
    if (!strcmp(module, "xmlIO")) return(test_xmlIO());
    if (!strcmp(module, "xmlautomata")) return(test_xmlautomata());
    if (!strcmp(module, "xmlerror")) return(test_xmlerror());
    if (!strcmp(module, "xmlmodule")) return(test_xmlmodule());
    if (!strcmp(module, "xmlreader")) return(test_xmlreader());
    if (!strcmp(module, "xmlregexp")) return(test_xmlregexp());
    if (!strcmp(module, "xmlsave")) return(test_xmlsave());
    if (!strcmp(module, "xmlschemas")) return(test_xmlschemas());
    if (!strcmp(module, "xmlschemastypes")) return(test_xmlschemastypes());
    if (!strcmp(module, "xmlstring")) return(test_xmlstring());
    if (!strcmp(module, "xmlunicode")) return(test_xmlunicode());
    if (!strcmp(module, "xmlwriter")) return(test_xmlwriter());
    if (!strcmp(module, "xpath")) return(test_xpath());
    if (!strcmp(module, "xpathInternals")) return(test_xpathInternals());
    if (!strcmp(module, "xpointer")) return(test_xpointer());
    return(0);
}